

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O0

int computeRevSOffset(vector<char,_std::allocator<char>_> *cigar)

{
  bool bVar1;
  reverse_iterator it;
  int offset;
  vector<char,_std::allocator<char>_> t;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  vector<char,_std::allocator<char>_> *this;
  vector<char,_std::allocator<char>_> local_38;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
  std::vector<char,_std::allocator<char>_>::rbegin(in_stack_ffffffffffffffa8);
  while( true ) {
    this = &local_38;
    std::vector<char,_std::allocator<char>_>::rend(in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
                             *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff98);
    if ((!bVar1) ||
       (in_stack_ffffffffffffffa8 =
             (vector<char,_std::allocator<char>_> *)
             std::
             reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
             ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
                          *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)),
       (in_stack_ffffffffffffffa8->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
       super__Tp_alloc_type != (_Tp_alloc_type)0x53)) break;
    local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ =
         local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ + 1;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  std::vector<char,_std::allocator<char>_>::~vector(this);
  return local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
}

Assistant:

int computeRevSOffset(const std::vector<char>& cigar){
    std::vector<char> t = cigar;
    int offset = 0;
    for (std::vector<char>::reverse_iterator it = t.rbegin(); it != t.rend(); ++it){
        if (*it == 'S'){
            offset++;
        } else break;
    }
    return offset;
}